

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_from.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformFrom
          (Transformer *this,optional_ptr<duckdb_libpgquery::PGList,_true> root)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  optional_ptr<duckdb_libpgquery::PGNode,_true> oVar2;
  undefined1 auVar3 [8];
  ParserOptions *pPVar4;
  PGList *pPVar5;
  pointer pJVar6;
  long in_RDX;
  optional_ptr<duckdb_libpgquery::PGNode,_true> oVar7;
  JoinRefType local_71;
  optional_ptr<duckdb_libpgquery::PGNode,_true> n;
  undefined1 local_68 [8];
  ParserOptions *local_60;
  optional_ptr<duckdb_libpgquery::PGList,_true> root_local;
  optional_ptr<duckdb_libpgquery::PGNode,_true> n_1;
  __node_base local_40;
  ParserOptions *local_38;
  
  if (in_RDX == 0) {
    make_uniq<duckdb::EmptyTableRef>();
  }
  else {
    pPVar5 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&root_local);
    if (pPVar5->length < 2) {
      pPVar5 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&root_local);
      n.ptr = *(PGNode **)&pPVar5->head->data;
      optional_ptr<duckdb_libpgquery::PGNode,_true>::operator*(&n);
      TransformTableRefNode(this,(PGNode *)root.ptr);
      return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>)this;
    }
    n_1.ptr._0_1_ = 2;
    make_uniq<duckdb::JoinRef,duckdb::JoinRefType>((duckdb *)&n,(JoinRefType *)&n_1);
    oVar7 = n;
    pPVar5 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&root_local);
    while (pPVar5 = (PGList *)pPVar5->head, pPVar5 != (PGList *)0x0) {
      n_1.ptr = *(PGNode **)pPVar5;
      optional_ptr<duckdb_libpgquery::PGNode,_true>::operator*(&n_1);
      TransformTableRefNode((Transformer *)local_68,(PGNode *)root.ptr);
      auVar3 = local_68;
      oVar2 = n;
      if (*(long *)(oVar7.ptr + 0x1a) == 0) {
        local_68 = (undefined1  [8])0x0;
        *(undefined1 (*) [8])(oVar7.ptr + 0x1a) = auVar3;
      }
      else if (*(long *)(oVar7.ptr + 0x1c) == 0) {
        local_68 = (undefined1  [8])0x0;
        *(undefined1 (*) [8])(oVar7.ptr + 0x1c) = auVar3;
      }
      else {
        n.ptr = (PGNode *)0x0;
        local_71 = CROSS;
        make_uniq<duckdb::JoinRef,duckdb::JoinRefType>((duckdb *)&local_60,&local_71);
        pPVar4 = local_60;
        oVar7 = n;
        local_60 = (ParserOptions *)0x0;
        n.ptr = (PGNode *)pPVar4;
        if ((oVar7.ptr != (PGNode *)0x0) &&
           ((**(code **)(*(long *)oVar7.ptr + 8))(), local_60 != (ParserOptions *)0x0)) {
          (**(code **)(*(long *)local_60 + 8))();
        }
        pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                           ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>
                             *)&n);
        _Var1._M_head_impl =
             (pJVar6->left).
             super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
             super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
             super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
        (pJVar6->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
        _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
        super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)oVar2.ptr;
        if (_Var1._M_head_impl != (TableRef *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
        }
        pJVar6 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                           ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>
                             *)&n);
        auVar3 = local_68;
        local_68 = (undefined1  [8])0x0;
        _Var1._M_head_impl =
             (pJVar6->right).
             super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
             super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
             super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
        (pJVar6->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
        _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
        super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)auVar3;
        oVar7 = n;
        if (_Var1._M_head_impl != (TableRef *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
          oVar7 = n;
        }
      }
      StackCheck((Transformer *)&stack0xffffffffffffffc0,(idx_t)root.ptr);
      local_40._M_nxt[0x19]._M_nxt =
           (_Hash_node_base *)((long)local_40._M_nxt[0x19]._M_nxt - (long)local_38);
    }
  }
  (this->parent).ptr = (Transformer *)n.ptr;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> Transformer::TransformFrom(optional_ptr<duckdb_libpgquery::PGList> root) {
	if (!root) {
		return make_uniq<EmptyTableRef>();
	}

	if (root->length > 1) {
		// Cross Product
		auto result = make_uniq<JoinRef>(JoinRefType::CROSS);
		JoinRef *cur_root = result.get();
		idx_t list_size = 0;
		for (auto node = root->head; node != nullptr; node = node->next) {
			auto n = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
			unique_ptr<TableRef> next = TransformTableRefNode(*n);
			if (!cur_root->left) {
				cur_root->left = std::move(next);
			} else if (!cur_root->right) {
				cur_root->right = std::move(next);
			} else {
				auto old_res = std::move(result);
				result = make_uniq<JoinRef>(JoinRefType::CROSS);
				result->left = std::move(old_res);
				result->right = std::move(next);
				cur_root = result.get();
			}
			list_size++;
			StackCheck(list_size);
		}
		return std::move(result);
	}

	auto n = PGPointerCast<duckdb_libpgquery::PGNode>(root->head->data.ptr_value);
	return TransformTableRefNode(*n);
}